

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QShaderDescription::BlockVariable*>,long_long>
               (reverse_iterator<QShaderDescription::BlockVariable_*> first,longlong n,
               reverse_iterator<QShaderDescription::BlockVariable_*> d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  Data *pDVar6;
  BlockVariable *pBVar7;
  BlockVariable *pBVar8;
  int iVar9;
  BlockVariable *pBVar10;
  BlockVariable *pBVar11;
  BlockVariable *pBVar12;
  BlockVariable *pBVar13;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (BlockVariable *)((d_first.current)->name).d.d;
  pBVar10 = local_58.end.current + -n;
  pBVar13 = (BlockVariable *)((first.current)->name).d.d;
  pBVar11 = local_58.end.current;
  pBVar8 = pBVar10;
  pBVar12 = pBVar13;
  if (pBVar10 < pBVar13) {
    pBVar8 = pBVar13;
    pBVar12 = pBVar10;
  }
  while (local_58.intermediate.current = pBVar11, pBVar11 != pBVar8) {
    pDVar1 = pBVar13[-1].name.d.d;
    pBVar13[-1].name.d.d = (Data *)0x0;
    pBVar11[-1].name.d.d = pDVar1;
    pcVar2 = pBVar13[-1].name.d.ptr;
    pBVar13[-1].name.d.ptr = (char *)0x0;
    pBVar11[-1].name.d.ptr = pcVar2;
    qVar3 = pBVar13[-1].name.d.size;
    pBVar13[-1].name.d.size = 0;
    pBVar11[-1].name.d.size = qVar3;
    iVar9 = pBVar13[-1].offset;
    pBVar11[-1].type = pBVar13[-1].type;
    pBVar11[-1].offset = iVar9;
    pBVar11[-1].size = pBVar13[-1].size;
    pDVar4 = pBVar13[-1].arrayDims.d.d;
    pBVar13[-1].arrayDims.d.d = (Data *)0x0;
    pBVar11[-1].arrayDims.d.d = pDVar4;
    piVar5 = pBVar13[-1].arrayDims.d.ptr;
    pBVar13[-1].arrayDims.d.ptr = (int *)0x0;
    pBVar11[-1].arrayDims.d.ptr = piVar5;
    qVar3 = pBVar13[-1].arrayDims.d.size;
    pBVar13[-1].arrayDims.d.size = 0;
    pBVar11[-1].arrayDims.d.size = qVar3;
    iVar9 = pBVar13[-1].matrixStride;
    pBVar11[-1].arrayStride = pBVar13[-1].arrayStride;
    pBVar11[-1].matrixStride = iVar9;
    pBVar11[-1].matrixIsRowMajor = pBVar13[-1].matrixIsRowMajor;
    pDVar6 = pBVar13[-1].structMembers.d.d;
    pBVar13[-1].structMembers.d.d = (Data *)0x0;
    pBVar11[-1].structMembers.d.d = pDVar6;
    pBVar7 = pBVar13[-1].structMembers.d.ptr;
    pBVar13[-1].structMembers.d.ptr = (BlockVariable *)0x0;
    pBVar11[-1].structMembers.d.ptr = pBVar7;
    qVar3 = pBVar13[-1].structMembers.d.size;
    pBVar13[-1].structMembers.d.size = 0;
    pBVar11[-1].structMembers.d.size = qVar3;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-7].super_QArrayData.alloc;
    pBVar13 = (BlockVariable *)&((first.current)->name).d.d[-7].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)pBVar13;
    pBVar11 = (BlockVariable *)((d_first.current)->name).d.d;
  }
  while (pBVar11 != pBVar10) {
    pDVar1 = pBVar11[-1].name.d.d;
    pBVar11[-1].name.d.d = pBVar13[-1].name.d.d;
    pBVar13[-1].name.d.d = pDVar1;
    pcVar2 = pBVar11[-1].name.d.ptr;
    pBVar11[-1].name.d.ptr = pBVar13[-1].name.d.ptr;
    pBVar13[-1].name.d.ptr = pcVar2;
    qVar3 = pBVar11[-1].name.d.size;
    pBVar11[-1].name.d.size = pBVar13[-1].name.d.size;
    pBVar13[-1].name.d.size = qVar3;
    pBVar11[-1].size = pBVar13[-1].size;
    iVar9 = pBVar13[-1].offset;
    pBVar11[-1].type = pBVar13[-1].type;
    pBVar11[-1].offset = iVar9;
    QArrayDataPointer<int>::operator=(&pBVar11[-1].arrayDims.d,&pBVar13[-1].arrayDims.d);
    iVar9 = pBVar13[-1].matrixStride;
    pBVar11[-1].arrayStride = pBVar13[-1].arrayStride;
    pBVar11[-1].matrixStride = iVar9;
    pBVar11[-1].matrixIsRowMajor = pBVar13[-1].matrixIsRowMajor;
    QArrayDataPointer<QShaderDescription::BlockVariable>::operator=
              (&pBVar11[-1].structMembers.d,&pBVar13[-1].structMembers.d);
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-7].super_QArrayData.alloc;
    pBVar13 = (BlockVariable *)&((first.current)->name).d.d[-7].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)pBVar13;
    pBVar11 = (BlockVariable *)((d_first.current)->name).d.d;
  }
  local_58.iter = &local_58.end;
  while (pBVar13 != pBVar12) {
    ((first.current)->name).d.d = (Data *)(pBVar13 + 1);
    QArrayDataPointer<QShaderDescription::BlockVariable>::~QArrayDataPointer
              (&(pBVar13->structMembers).d);
    pDVar4 = (pBVar13->arrayDims).d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pBVar13->arrayDims).d.d)->super_QArrayData,4,0x10);
      }
    }
    piVar5 = *(int **)&(pBVar13->name).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pBVar13->name).d.d,1,0x10);
      }
    }
    pBVar13 = (BlockVariable *)((first.current)->name).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QShaderDescription::BlockVariable_*>,_long_long>
  ::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}